

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_47aea5::CheckUnparsable(string *prv,string *pub,string *expected_error)

{
  bool bVar1;
  FlatSigningProvider *in_RDX;
  string *in_RSI;
  long in_FS_OFFSET;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_pub;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_priv;
  string error;
  FlatSigningProvider keys_pub;
  FlatSigningProvider keys_priv;
  FlatSigningProvider *in_stack_fffffffffffffc28;
  FlatSigningProvider *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  const_string *in_stack_fffffffffffffc50;
  const_string *msg;
  const_string *line_num;
  const_string *file;
  unit_test_log_t *this;
  undefined1 in_stack_fffffffffffffc77;
  string *in_stack_fffffffffffffc78;
  undefined1 local_368 [16];
  undefined1 local_358 [64];
  const_string local_318;
  lazy_ostream local_308 [2];
  assertion_result local_2e8;
  lazy_ostream local_2a0 [2];
  assertion_result local_280 [2];
  unit_test_log_t local_218 [35];
  const_string local_100 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = local_100;
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffc28);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffc28);
  this = local_218;
  std::__cxx11::string::string(in_stack_fffffffffffffc40);
  Parse(in_RSI,in_RDX,in_stack_fffffffffffffc78,(bool)in_stack_fffffffffffffc77);
  Parse(in_RSI,in_RDX,in_stack_fffffffffffffc78,(bool)in_stack_fffffffffffffc77);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,file,(size_t)line_num,in_stack_fffffffffffffc50);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffc38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc38,
               SUB81((ulong)in_stack_fffffffffffffc30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 = (FlatSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_280,local_2a0,(const_string *)&stack0xfffffffffffffd50,0x1d,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint(this,file,(size_t)line_num,msg);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffc38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc38,
               SUB81((ulong)in_stack_fffffffffffffc30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 = (FlatSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion(&local_2e8,local_308,&local_318,0x1e,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint(this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc30,(char (*) [1])in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc30 = in_RDX;
    in_stack_fffffffffffffc38 = "expected_error";
    in_stack_fffffffffffffc28 = (FlatSigningProvider *)0x1e8a49d;
    in_RDX = in_stack_fffffffffffffc30;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_358,local_368,0x1f,1,2,local_218);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffc38);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffc38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffc28);
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffc28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckUnparsable(const std::string& prv, const std::string& pub, const std::string& expected_error)
{
    FlatSigningProvider keys_priv, keys_pub;
    std::string error;
    auto parse_priv = Parse(prv, keys_priv, error);
    auto parse_pub = Parse(pub, keys_pub, error);
    BOOST_CHECK_MESSAGE(parse_priv.empty(), prv);
    BOOST_CHECK_MESSAGE(parse_pub.empty(), pub);
    BOOST_CHECK_EQUAL(error, expected_error);
}